

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O1

void __thiscall
license::Project::Project
          (Project *this,string *name,string *project_folder,string *source_folder,
          bool force_overwrite)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  path *ppVar4;
  long lVar5;
  invalid_argument *this_00;
  runtime_error *prVar6;
  long *plVar7;
  size_type *psVar8;
  long *plVar9;
  char cVar10;
  undefined3 in_register_00000081;
  path template_fname2;
  path template_fname;
  path templates_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined4 local_cc;
  string *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_cc = CONCAT31(in_register_00000081,force_overwrite);
  paVar1 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar3,pcVar3 + name->_M_string_length);
  local_c0 = &(this->m_project_folder).field_2;
  (this->m_project_folder)._M_dataplus._M_p = (pointer)local_c0;
  pcVar3 = (project_folder->_M_dataplus)._M_p;
  local_b8 = paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_project_folder,pcVar3,pcVar3 + project_folder->_M_string_length);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  pcVar3 = (source_folder->_M_dataplus)._M_p;
  local_c8 = &this->m_project_folder;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar3,pcVar3 + source_folder->_M_string_length);
  boost::filesystem::detail::status((detail *)&local_110,(path *)&local_f0,(error_code *)0x0);
  if ((uint)local_110._M_dataplus._M_p < 2) {
LAB_001833a8:
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Templates directory [","")
    ;
    std::operator+(&local_130,&local_150,&local_f0);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_130);
    local_110._M_dataplus._M_p = (pointer)*plVar7;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_110._M_dataplus._M_p == psVar8) {
      local_110.field_2._M_allocated_capacity = *psVar8;
      local_110.field_2._8_8_ = plVar7[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar8;
    }
    local_110._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::runtime_error::runtime_error(prVar6,(string *)&local_110);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  boost::filesystem::detail::status((detail *)&local_110,(path *)&local_f0,(error_code *)0x0);
  if ((uint)local_110._M_dataplus._M_p != 3) goto LAB_001833a8;
  paVar1 = &local_130.field_2;
  local_130.field_2._M_allocated_capacity._0_7_ = 0x5f63696c627570;
  local_130.field_2._M_local_buf[7] = 'k';
  local_130.field_2._8_7_ = 0x616a6e692e7965;
  local_130._M_string_length = 0xf;
  local_130.field_2._M_local_buf[0xf] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,local_f0._M_dataplus._M_p,
             local_f0._M_dataplus._M_p + local_f0._M_string_length);
  boost::filesystem::path::operator/=((path *)&local_110,(path *)&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  boost::filesystem::detail::status((detail *)&local_130,(path *)&local_110,(error_code *)0x0);
  if (1 < (uint)local_130._M_dataplus._M_p) {
    boost::filesystem::detail::status((detail *)&local_130,(path *)&local_110,(error_code *)0x0);
    if ((uint)local_130._M_dataplus._M_p == 2) goto LAB_0018328d;
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_150.field_2._M_allocated_capacity._0_7_ = 0x74616c706d6574;
  local_150.field_2._M_local_buf[7] = 'e';
  local_150.field_2._8_2_ = 0x73;
  local_150._M_string_length = 9;
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,local_f0._M_dataplus._M_p,
             local_f0._M_dataplus._M_p + local_f0._M_string_length);
  boost::filesystem::path::operator/=((path *)&local_130,(path *)&local_150);
  std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  paVar2 = &local_150.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_150.field_2._M_allocated_capacity._0_7_ = 0x5f63696c627570;
  local_150.field_2._M_local_buf[7] = 'k';
  local_150.field_2._8_2_ = 0x7965;
  local_150.field_2._10_5_ = 0x616a6e692e;
  local_150._M_string_length = 0xf;
  local_150.field_2._M_local_buf[0xf] = '\0';
  local_150._M_dataplus._M_p = (pointer)paVar2;
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,local_f0._M_dataplus._M_p,
             local_f0._M_dataplus._M_p + local_f0._M_string_length);
  boost::filesystem::path::operator/=((path *)&local_130,(path *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  boost::filesystem::detail::status((detail *)&local_150,(path *)&local_130,(error_code *)0x0);
  if (1 < (uint)local_150._M_dataplus._M_p) {
    boost::filesystem::detail::status((detail *)&local_150,(path *)&local_130,(error_code *)0x0);
    if ((uint)local_150._M_dataplus._M_p == 2) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p);
      }
LAB_0018328d:
      ppVar4 = boost::filesystem::path::normalize((path *)&local_f0);
      pcVar3 = (ppVar4->m_pathname)._M_dataplus._M_p;
      local_130._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar3,pcVar3 + (ppVar4->m_pathname)._M_string_length);
      (this->m_templates_folder)._M_dataplus._M_p = (pointer)&(this->m_templates_folder).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&this->m_templates_folder,local_130._M_dataplus._M_p,
                 local_130._M_dataplus._M_p + local_130._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      this->m_force_overwrite = SUB41(local_cc,0);
      cVar10 = (char)name;
      lVar5 = std::__cxx11::string::find(cVar10,0x5b);
      if (lVar5 == -1) {
        lVar5 = std::__cxx11::string::find(cVar10,0x5d);
        if (lVar5 == -1) {
          lVar5 = std::__cxx11::string::find(cVar10,0x2f);
          if (lVar5 == -1) {
            lVar5 = std::__cxx11::string::find(cVar10,0x5c);
            if (lVar5 == -1) {
              return;
            }
          }
        }
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,"project name should not contain any of \'[ ] / \' characters.");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Templates file [","");
  std::operator+(&local_70,&local_90,&local_130);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_b0._M_dataplus._M_p = (pointer)*plVar7;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar8) {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0.field_2._8_8_ = plVar7[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar8;
  }
  local_b0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::operator+(&local_50,&local_b0,&local_110);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_150._M_dataplus._M_p = (pointer)*plVar7;
  plVar9 = plVar7 + 2;
  if ((long *)local_150._M_dataplus._M_p == plVar9) {
    lVar5 = plVar7[3];
    local_150.field_2._M_allocated_capacity._0_7_ = (undefined7)*plVar9;
    local_150.field_2._M_local_buf[7] = (char)((ulong)*plVar9 >> 0x38);
    local_150.field_2._8_2_ = (undefined2)lVar5;
    local_150.field_2._10_5_ = (undefined5)((ulong)lVar5 >> 0x10);
    local_150.field_2._M_local_buf[0xf] = (char)((ulong)lVar5 >> 0x38);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  }
  else {
    local_150.field_2._M_allocated_capacity._0_7_ = (undefined7)*plVar9;
    local_150.field_2._M_local_buf[7] = (char)((ulong)*plVar9 >> 0x38);
  }
  local_150._M_string_length = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::runtime_error::runtime_error(prVar6,(string *)&local_150);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Project::Project(const std::string &name, const std::string &project_folder, const std::string &source_folder,
				 bool force_overwrite)
	: m_name(name),
	  m_project_folder(project_folder),
	  m_templates_folder(guess_templates_folder(source_folder)),
	  m_force_overwrite(force_overwrite) {
	if (name.find('[') != std::string::npos || name.find(']') != std::string::npos ||
		name.find('/') != std::string::npos || name.find('\\') != std::string::npos) {
		throw invalid_argument("project name should not contain any of '[ ] / \' characters.");
	}
}